

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O1

void mp::WriteJSON<mp::QuadAndLinTerms,mp::AlgConRhs<1>>
               (JSONW *jw,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *algc)

{
  double dVar1;
  Node *this;
  string_view key;
  string_view key_00;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_48;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_38;
  double local_28;
  char *local_20;
  
  key._M_str = (char *)0x4;
  key._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_38,key);
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::QuadAndLinTerms>
            (&local_38,&algc->super_QuadAndLinTerms);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_38);
  key_00._M_str = (char *)0xc;
  key_00._M_len = (size_t)jw;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_48,key_00)
  ;
  dVar1 = (algc->super_AlgConRhs<1>).rhs_;
  local_20 = "GE";
  this = MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator<<
                   ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_48,
                    &local_20);
  local_28 = dVar1;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator<<
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)this,&local_28);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_48);
  return;
}

Assistant:

inline void WriteJSON(JSONW jw,
                      const AlgebraicConstraint<Body, RhsOrRange>& algc) {
  WriteJSON(jw["body"], algc.GetBody());
  WriteJSON(jw["rhs_or_range"], algc.GetRhsOrRange());
}